

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.h
# Opt level: O0

void __thiscall
spvtools::opt::ConvertToSampledImagePass::ConvertToSampledImagePass
          (ConvertToSampledImagePass *this,
          vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
          *descriptor_set_binding_pairs)

{
  allocator<spvtools::opt::DescriptorSetAndBinding> local_2b;
  key_equal local_2a;
  hasher local_29;
  __normal_iterator<const_spvtools::opt::DescriptorSetAndBinding_*,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
  local_28;
  __normal_iterator<const_spvtools::opt::DescriptorSetAndBinding_*,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
  local_20;
  vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
  *local_18;
  vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
  *descriptor_set_binding_pairs_local;
  ConvertToSampledImagePass *this_local;
  
  local_18 = descriptor_set_binding_pairs;
  descriptor_set_binding_pairs_local =
       (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
        *)this;
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__ConvertToSampledImagePass_010ecbd8;
  local_20._M_current =
       (DescriptorSetAndBinding *)
       std::
       vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
       ::begin(local_18);
  local_28._M_current =
       (DescriptorSetAndBinding *)
       std::
       vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
       ::end(local_18);
  std::allocator<spvtools::opt::DescriptorSetAndBinding>::allocator(&local_2b);
  std::
  unordered_set<spvtools::opt::DescriptorSetAndBinding,spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,std::equal_to<spvtools::opt::DescriptorSetAndBinding>,std::allocator<spvtools::opt::DescriptorSetAndBinding>>
  ::
  unordered_set<__gnu_cxx::__normal_iterator<spvtools::opt::DescriptorSetAndBinding_const*,std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
            ((unordered_set<spvtools::opt::DescriptorSetAndBinding,spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,std::equal_to<spvtools::opt::DescriptorSetAndBinding>,std::allocator<spvtools::opt::DescriptorSetAndBinding>>
              *)&this->descriptor_set_binding_pairs_,local_20,local_28,0,&local_29,&local_2a,
             &local_2b);
  std::allocator<spvtools::opt::DescriptorSetAndBinding>::~allocator(&local_2b);
  return;
}

Assistant:

explicit ConvertToSampledImagePass(
      const std::vector<DescriptorSetAndBinding>& descriptor_set_binding_pairs)
      : descriptor_set_binding_pairs_(descriptor_set_binding_pairs.begin(),
                                      descriptor_set_binding_pairs.end()) {}